

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

type __thiscall
nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
operator=(optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *this,
         optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *other)

{
  value_type *pvVar1;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      reset(this);
    }
    else {
      pvVar1 = operator*(other);
      tinyusdz::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_move_assign
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->contained,
                 pvVar1);
    }
  }
  else if (other->has_value_ != false) {
    pvVar1 = operator*(other);
    optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
    initialize<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
              ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)this,pvVar1
              );
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }